

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
* __thiscall
Board::get_possible_moves
          (map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
           *__return_storage_ptr__,Board *this,Color color)

{
  undefined8 *puVar1;
  map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
  *pmVar2;
  char cVar3;
  short y;
  int iVar4;
  _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_> *this_00;
  undefined7 in_register_00000011;
  short x;
  set<Point,_std::less<Point>,_std::allocator<Point>_> piece_possible_moves;
  map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
  possible_moves;
  Point local_a4;
  int local_a0;
  undefined4 local_9c;
  map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
  *local_98;
  Point local_90 [10];
  long local_68;
  _Rb_tree<Point,_std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>,_std::_Select1st<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
  local_60;
  
  local_9c = (undefined4)CONCAT71(in_register_00000011,color);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar4 = 0;
  local_98 = __return_storage_ptr__;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pmVar2 = local_98, y = (short)iVar4, y != 8) {
    local_a0 = iVar4;
    for (x = 0; x != 8; x = x + 1) {
      Point::Point(local_90,x,y);
      if (*(long *)(*(long *)&(this->m_board).m_data.
                              super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_90[0].m_x].
                              super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                   + (long)local_90[0].m_y * 0x10) != 0) {
        Point::Point(&local_a4,x,y);
        cVar3 = (**(code **)(**(long **)(*(long *)&(this->m_board).m_data.
                                                                                                      
                                                  super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [local_a4.m_x].
                                                  super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                                        + (long)local_a4.m_y * 0x10) + 0x20))();
        if (cVar3 == (char)local_9c) {
          Point::Point(&local_a4,x,y);
          puVar1 = *(undefined8 **)
                    (*(long *)&(this->m_board).m_data.
                               super__Vector_base<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>,_std::allocator<std::vector<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[local_a4.m_x].
                               super__Vector_base<std::shared_ptr<Piece>,_std::allocator<std::shared_ptr<Piece>_>_>
                    + (long)local_a4.m_y * 0x10);
          (**(code **)*puVar1)(local_90,puVar1,this);
          if (local_68 != 0) {
            Point::Point(&local_a4,x,y);
            this_00 = &std::
                       map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
                       ::operator[]((map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
                                     *)&local_60,&local_a4)->_M_t;
            std::
            _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>
            ::operator=(this_00,(_Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>
                                 *)local_90);
          }
          std::
          _Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>::
          ~_Rb_tree((_Rb_tree<Point,_Point,_std::_Identity<Point>,_std::less<Point>,_std::allocator<Point>_>
                     *)local_90);
        }
      }
    }
    iVar4 = local_a0 + 1;
  }
  std::_Rb_tree_header::_Rb_tree_header
            (&(local_98->_M_t)._M_impl.super__Rb_tree_header,&local_60._M_impl.super__Rb_tree_header
            );
  std::
  _Rb_tree<Point,_std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>,_std::_Select1st<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return pmVar2;
}

Assistant:

map<Point, set<Point>> Board::get_possible_moves(Color color) const {
    map<Point, set<Point>> possible_moves;

    for (dimension i = 0; i < SIZE; i++) {
        for (dimension j = 0; j < SIZE; j++) {
            if ((m_board[{j, i}] == nullptr) || (m_board[{j, i}]->get_color() != color)) continue;
            auto piece_possible_moves = m_board[{j, i}]->get_possible_positions(m_board);
            if (!piece_possible_moves.empty()) {
                possible_moves[{j, i}] = piece_possible_moves;
            }
        }
    }

    return move(possible_moves);
}